

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O1

void output_conll(vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *pos,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *sentenceUnkStrings,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToWords,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToPos,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *hyp,
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *rel_hyp)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  _Base_ptr p_Var3;
  pointer puVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  ostream *poVar9;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  pointer pbVar14;
  char cVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hyp_rel;
  string wit;
  key_type local_d0;
  key_type local_b0;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  _Base_ptr local_88;
  int local_7c;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_70;
  string local_68;
  undefined7 uStack_67;
  undefined1 local_58 [16];
  _Rb_tree_header *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  long local_38;
  
  puVar4 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_90 = intToWords;
  local_78 = intToPos;
  local_70 = hyp;
  local_40 = pos;
  if ((long)(sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar4 != 4) {
    p_Var10 = &(intToWords->_M_t)._M_impl.super__Rb_tree_header;
    local_88 = &(intToPos->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = &(hyp->_M_t)._M_impl.super__Rb_tree_header;
    local_48 = &(rel_hyp->_M_t)._M_impl.super__Rb_tree_header;
    uVar16 = 0;
    uVar17 = 0;
    do {
      if ((ulong)((long)(sentenceUnkStrings->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sentenceUnkStrings->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar16)
      goto LAB_0017c6c5;
      mVar2 = puVar4[uVar16];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"UNK","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&corpus.wordsToInt,&local_b0);
      if (*pmVar5 == 0) {
        *pmVar5 = corpus.max;
        corpus.max = corpus.max + 1;
        pmVar6 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&corpus.intToWords,pmVar5);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        corpus.nwords = corpus.max;
      }
      if ((mVar2 != *pmVar5) ||
         ((sentenceUnkStrings->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_string_length == 0)) {
        mVar2 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar16];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"UNK","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&corpus.wordsToInt,&local_d0);
        if (*pmVar5 == 0) {
          *pmVar5 = corpus.max;
          corpus.max = corpus.max + 1;
          pmVar6 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&corpus.intToWords,pmVar5);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          corpus.nwords = corpus.max;
        }
        if ((mVar2 == *pmVar5) ||
           ((sentenceUnkStrings->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_string_length != 0)) {
LAB_0017c6c5:
          __assert_fail("i < sentenceUnkStrings.size() && ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() > 0) || (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() == 0 && intToWords.find(sentence[i]) != intToWords.end()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                        ,0x36a,
                        "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                       );
        }
        puVar4 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        p_Var13 = (local_90->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var10->_M_header;
        if (p_Var13 != (_Base_ptr)0x0) {
          do {
            bVar18 = p_Var13[1]._M_color < puVar4[uVar16];
            if (!bVar18) {
              p_Var7 = p_Var13;
            }
            p_Var13 = (&p_Var13->_M_left)[bVar18];
          } while (p_Var13 != (_Base_ptr)0x0);
        }
        p_Var13 = &p_Var10->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var10) &&
           (p_Var13 = p_Var7, puVar4[uVar16] < p_Var7[1]._M_color)) {
          p_Var13 = &p_Var10->_M_header;
        }
        if ((_Rb_tree_header *)p_Var13 == p_Var10) goto LAB_0017c6c5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      pbVar14 = (sentenceUnkStrings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar14[uVar16]._M_string_length == 0) {
        puVar4 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        p_Var13 = (local_90->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var10->_M_header;
        if (p_Var13 != (_Base_ptr)0x0) {
          do {
            bVar18 = p_Var13[1]._M_color < puVar4[uVar16];
            if (!bVar18) {
              p_Var7 = p_Var13;
            }
            p_Var13 = (&p_Var13->_M_left)[bVar18];
          } while (p_Var13 != (_Base_ptr)0x0);
        }
        p_Var13 = &p_Var10->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var10) &&
           (p_Var13 = p_Var7, puVar4[uVar16] < p_Var7[1]._M_color)) {
          p_Var13 = &p_Var10->_M_header;
        }
        pbVar14 = (pointer)&p_Var13[1]._M_parent;
      }
      else {
        pbVar14 = pbVar14 + uVar16;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      p_Var13 = (_Base_ptr)(pbVar14->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,p_Var13,
                 (long)&p_Var13->_M_color + (long)&((_Base_ptr)pbVar14->_M_string_length)->_M_color)
      ;
      puVar4 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var13 = (local_78->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = local_88;
      if (p_Var13 != (_Base_ptr)0x0) {
        do {
          bVar18 = p_Var13[1]._M_color < puVar4[uVar16];
          if (!bVar18) {
            p_Var7 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[bVar18];
        } while (p_Var13 != (_Base_ptr)0x0);
      }
      p_Var13 = local_88;
      if ((p_Var7 != local_88) && (p_Var13 = p_Var7, puVar4[uVar16] < p_Var7[1]._M_color)) {
        p_Var13 = local_88;
      }
      p_Var3 = (local_70->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (p_Var7 = p_Var3; p_Var7 != (_Base_ptr)0x0;
          p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < (int)uVar17]) {
        if ((int)uVar17 <= (int)p_Var7[1]._M_color) {
          p_Var11 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var7 = p_Var11, (int)uVar17 < (int)p_Var11[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      p_Var11 = &p_Var1->_M_header;
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        __assert_fail("hyp.find(i) != hyp.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                      ,0x36e,
                      "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                     );
      }
      for (; p_Var3 != (_Base_ptr)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)uVar17]) {
        if ((int)uVar17 <= (int)p_Var3[1]._M_color) {
          p_Var11 = p_Var3;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var7 = p_Var11, (int)uVar17 < (int)p_Var11[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      local_7c = *(int *)&p_Var7[1].field_0x4 + 1;
      if (local_7c ==
          (int)((ulong)((long)(sentence->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(sentence->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
        local_7c = 0;
      }
      p_Var8 = local_48;
      for (p_Var7 = (rel_hyp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
          p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < (int)uVar17]) {
        if ((int)uVar17 <= (int)*(size_t *)(p_Var7 + 1)) {
          p_Var8 = (_Rb_tree_header *)p_Var7;
        }
      }
      p_Var12 = local_48;
      if ((p_Var8 != local_48) && (p_Var12 = p_Var8, (int)uVar17 < (int)p_Var8->_M_node_count)) {
        p_Var12 = local_48;
      }
      if (p_Var12 == local_48) {
        __assert_fail("hyp_rel_it != rel_hyp.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                      ,0x372,
                      "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                     );
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)(p_Var12 + 1),
                 *(long *)(p_Var12 + 1) + *(long *)((long)(p_Var12 + 1) + 8));
      cVar15 = (char)&local_d0;
      local_38 = std::__cxx11::string::find(cVar15,0x28);
      local_38 = local_38 + 1;
      std::__cxx11::string::rfind(cVar15,0x29);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)&local_d0);
      std::__cxx11::string::operator=((string *)&local_d0,&local_68);
      if ((undefined1 *)CONCAT71(uStack_67,local_68) != local_58) {
        operator_delete((undefined1 *)CONCAT71(uStack_67,local_68));
      }
      uVar17 = uVar17 + 1;
      uVar16 = (ulong)uVar17;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)p_Var13[1]._M_parent,(long)p_Var13[1]._M_left);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_7c);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
      local_68 = (string)0x9;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      puVar4 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar16 < ((long)(sentence->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) - 1U);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void output_conll(const vector<unsigned>& sentence, const vector<unsigned>& pos,
                  const vector<string>& sentenceUnkStrings, 
                  const map<unsigned, string>& intToWords, 
                  const map<unsigned, string>& intToPos, 
                  const map<int,int>& hyp, const map<int,string>& rel_hyp) {
  for (unsigned i = 0; i < (sentence.size()-1); ++i) {
    auto index = i + 1;
    assert(i < sentenceUnkStrings.size() && 
           ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() > 0) ||
            (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() == 0 &&
             intToWords.find(sentence[i]) != intToWords.end())));
    string wit = (sentenceUnkStrings[i].size() > 0)? 
      sentenceUnkStrings[i] : intToWords.find(sentence[i])->second;
    auto pit = intToPos.find(pos[i]);
    assert(hyp.find(i) != hyp.end());
    auto hyp_head = hyp.find(i)->second + 1;
    if (hyp_head == (int)sentence.size()) hyp_head = 0;
    auto hyp_rel_it = rel_hyp.find(i);
    assert(hyp_rel_it != rel_hyp.end());
    auto hyp_rel = hyp_rel_it->second;
    size_t first_char_in_rel = hyp_rel.find('(') + 1;
    size_t last_char_in_rel = hyp_rel.rfind(')') - 1;
    hyp_rel = hyp_rel.substr(first_char_in_rel, last_char_in_rel - first_char_in_rel + 1);
    cout << index << '\t'       // 1. ID 
         << wit << '\t'         // 2. FORM
         << "_" << '\t'         // 3. LEMMA 
         << "_" << '\t'         // 4. CPOSTAG 
         << pit->second << '\t' // 5. POSTAG
         << "_" << '\t'         // 6. FEATS
         << hyp_head << '\t'    // 7. HEAD
         << hyp_rel << '\t'     // 8. DEPREL
         << "_" << '\t'         // 9. PHEAD
         << "_" << endl;        // 10. PDEPREL
  }
  cout << endl;
}